

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O1

void __thiscall kj::_::anon_unknown_0::TestCase129::run(TestCase129 *this)

{
  ExceptionCallback *this_00;
  DebugExpression<bool> _kjCondition;
  NullableValue<kj::Exception> _e130;
  
  this_00 = (ExceptionCallback *)operator_new(0x10);
  ExceptionCallback::ExceptionCallback(this_00);
  _e130.isSet = false;
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x82,ERROR,"\"code did not throw: \" \"new ExceptionCallback\"",
               (char (*) [42])"code did not throw: new ExceptionCallback");
  }
  if (_e130.isSet == true) {
    Exception::~Exception(&_e130.field_1.value);
  }
  return;
}

Assistant:

TEST(Exception, ExceptionCallbackMustBeOnStack) {
  KJ_EXPECT_THROW_MESSAGE("must be allocated on the stack", new ExceptionCallback);
}